

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_delegate.cc
# Opt level: O3

void absl::lts_20240722::base_internal::ThrowStdOverflowError(char *what_arg)

{
  overflow_error *this;
  
  this = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this,what_arg);
  __cxa_throw(this,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void ThrowStdOverflowError(const char* what_arg) {
#ifdef ABSL_HAVE_EXCEPTIONS
  throw std::overflow_error(what_arg);
#else
  ABSL_RAW_LOG(FATAL, "%s", what_arg);
  std::abort();
#endif
}